

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

void __thiscall ICM::Compiler::PreliminaryCompile::resetNode(PreliminaryCompile *this,Node *node)

{
  pointer pEVar1;
  Element front;
  value_type local_18;
  
  pEVar1 = (node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
           super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl
           .super__Vector_impl_data._M_start;
  local_18.field_0 = pEVar1->field_0;
  local_18._4_4_ = *(undefined4 *)&pEVar1->field_0x4;
  local_18.index = pEVar1->index;
  if ((node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
      super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar1) {
    (node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
    super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl.
    super__Vector_impl_data._M_finish = pEVar1;
  }
  std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::push_back
            (&node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,
             &local_18);
  return;
}

Assistant:

void resetNode(Node &node) {
				Element front = node.front();
				node.clear();
				node.push_back(front);
			}